

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O3

int __thiscall icu_63::RuleBasedNumberFormat::init(RuleBasedNumberFormat *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  short sVar2;
  int iVar3;
  UnicodeString *pUVar4;
  ushort uVar5;
  UBool UVar6;
  int in_EAX;
  uint uVar7;
  uint uVar8;
  int32_t iVar9;
  int32_t iVar10;
  int extraout_EAX;
  NFRule *pNVar11;
  UnicodeString *pUVar12;
  NFRuleSet **ppNVar13;
  long *plVar14;
  NFRuleSet *pNVar15;
  undefined4 extraout_var;
  ushort uVar16;
  undefined8 *in_RCX;
  char16_t *pcVar17;
  LocalizationInfo *in_RDX;
  long lVar18;
  UErrorCode UVar19;
  int iVar20;
  UChar *pUVar21;
  size_t size;
  RuleBasedNumberFormat *pRVar22;
  UMemory *this_00;
  uint uVar23;
  UErrorCode *in_R8;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  UnicodeString description;
  UnicodeString name;
  undefined1 local_e0 [10];
  char16_t local_d6 [27];
  RuleBasedNumberFormat *local_a0;
  ConstChar16Ptr local_98;
  UnicodeString *local_90;
  LocalizationInfo *local_88;
  char16_t *local_80;
  UnicodeString local_70;
  
  in_RCX[6] = 0;
  in_RCX[7] = 0;
  in_RCX[4] = 0;
  in_RCX[5] = 0;
  in_RCX[2] = 0;
  in_RCX[3] = 0;
  *in_RCX = 0;
  in_RCX[1] = 0;
  in_RCX[8] = 0;
  if (U_ZERO_ERROR < *in_R8) {
    return in_EAX;
  }
  initializeDecimalFormatSymbols(this,in_R8);
  initializeDefaultInfinityRule(this,in_R8);
  pNVar11 = initializeDefaultNaNRule(this,in_R8);
  if (U_ZERO_ERROR < *in_R8) {
    return (int)pNVar11;
  }
  if (in_RDX != (LocalizationInfo *)0x0) {
    in_RDX->refcount = in_RDX->refcount + 1;
  }
  this->localizations = in_RDX;
  pRVar22 = (RuleBasedNumberFormat *)local_e0;
  local_88 = in_RDX;
  UnicodeString::UnicodeString((UnicodeString *)pRVar22,(UnicodeString *)ctx);
  uVar7 = local_d6._2_4_;
  if (-1 < (short)local_e0._8_2_) {
    uVar7 = (int)(short)local_e0._8_2_ >> 5;
  }
  UVar19 = U_MEMORY_ALLOCATION_ERROR;
  if (uVar7 != 0) {
    stripWhitespace(pRVar22,(UnicodeString *)local_e0);
    uVar7 = local_d6._2_4_;
    if (-1 < (short)local_e0._8_2_) {
      uVar7 = (int)(short)local_e0._8_2_ >> 5;
    }
    uVar23 = (int)uVar7 >> 0x1f & uVar7;
    local_90 = (UnicodeString *)ctx;
    uVar7 = UnicodeString::indexOf
                      ((UnicodeString *)local_e0,L"%%lenient-parse:",0,-1,uVar23,uVar7 - uVar23);
    if (uVar7 == 0xffffffff) {
LAB_0021c79d:
      this->numRuleSets = 0;
      uVar7 = local_d6._2_4_;
      if (-1 < (short)local_e0._8_2_) {
        uVar7 = (int)(short)local_e0._8_2_ >> 5;
      }
      uVar23 = (int)uVar7 >> 0x1f & uVar7;
      pUVar21 = L";%";
      iVar20 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",0,2,uVar23,uVar7 - uVar23);
      while( true ) {
        iVar3 = this->numRuleSets;
        this->numRuleSets = iVar3 + 1;
        if (iVar20 == -1) break;
        if (iVar20 < -1) {
          uVar7 = 0;
        }
        else {
          uVar7 = (int)(short)local_e0._8_2_ >> 5;
          if ((short)local_e0._8_2_ < 0) {
            uVar7 = local_d6._2_4_;
          }
          if ((int)(iVar20 + 1U) <= (int)uVar7) {
            uVar7 = iVar20 + 1U;
          }
        }
        uVar23 = (int)(short)local_e0._8_2_ >> 5;
        if ((short)local_e0._8_2_ < 0) {
          uVar23 = local_d6._2_4_;
        }
        pUVar21 = L";%";
        iVar20 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",0,2,uVar7,uVar23 - uVar7);
      }
      ppNVar13 = (NFRuleSet **)uprv_malloc_63((long)iVar3 * 8 + 0x10);
      this->fRuleSets = ppNVar13;
      if (ppNVar13 == (NFRuleSet **)0x0) {
LAB_0021ca58:
        UVar19 = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        uVar7 = this->numRuleSets;
        lVar26 = (long)(int)uVar7;
        if (-1 < lVar26) {
          lVar18 = 0;
          do {
            pUVar21 = (UChar *)this->fRuleSets;
            *(NFRuleSet **)((long)pUVar21 + lVar18 * 8) = (NFRuleSet *)0x0;
            lVar18 = lVar18 + 1;
          } while ((ulong)uVar7 + 1 != lVar18);
          if (uVar7 == 0) {
            UVar19 = U_ILLEGAL_ARGUMENT_ERROR;
            goto LAB_0021cbc2;
          }
        }
        this_00 = (UMemory *)0xffffffffffffffff;
        if (-1 < (int)uVar7) {
          this_00 = (UMemory *)(lVar26 * 0x40 + 8);
        }
        plVar14 = (long *)UMemory::operator_new__(this_00,(size_t)pUVar21);
        if (plVar14 == (long *)0x0) {
          lVar26 = 0x170;
          goto LAB_0021ca6b;
        }
        *plVar14 = lVar26;
        lVar18 = 0;
        do {
          *(undefined ***)((long)plVar14 + lVar18 + 8) = &PTR__UnicodeString_003e5ab8;
          *(undefined2 *)((long)plVar14 + lVar18 + 0x10) = 2;
          lVar18 = lVar18 + 0x40;
        } while (lVar26 * 0x40 != lVar18);
        this->ruleSetDescriptions = (UnicodeString *)(plVar14 + 1);
        uVar24 = 0;
        iVar20 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",2,0);
        uVar7 = 0;
        if (iVar20 != -1) {
          lVar26 = 0;
          uVar24 = 0;
          uVar23 = 0;
          local_a0 = this;
          do {
            pUVar4 = local_a0->ruleSetDescriptions;
            pUVar12 = (UnicodeString *)
                      ((long)&(pUVar4->super_Replaceable).super_UObject._vptr_UObject + lVar26);
            UnicodeString::unBogus(pUVar12);
            sVar2 = *(short *)((long)&pUVar4->fUnion + lVar26);
            if (sVar2 < 0) {
              iVar9 = *(int32_t *)((long)&pUVar4->fUnion + lVar26 + 4);
            }
            else {
              iVar9 = (int)sVar2 >> 5;
            }
            uVar7 = iVar20 + 1;
            size = 0;
            UnicodeString::doReplace
                      (pUVar12,0,iVar9,(UnicodeString *)local_e0,uVar23,uVar7 - uVar23);
            pNVar15 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,size);
            pRVar22 = local_a0;
            if (pNVar15 != (NFRuleSet *)0x0) {
              NFRuleSet::NFRuleSet
                        (pNVar15,local_a0,local_a0->ruleSetDescriptions,(int32_t)uVar24,in_R8);
            }
            pRVar22->fRuleSets[uVar24] = pNVar15;
            if (pRVar22->fRuleSets[uVar24] == (NFRuleSet *)0x0) goto LAB_0021ca58;
            if (iVar20 < -1) {
              uVar23 = 0;
            }
            else {
              uVar23 = (int)(short)local_e0._8_2_ >> 5;
              if ((short)local_e0._8_2_ < 0) {
                uVar23 = local_d6._2_4_;
              }
              if ((int)uVar7 <= (int)uVar23) {
                uVar23 = uVar7;
              }
            }
            uVar8 = (int)(short)local_e0._8_2_ >> 5;
            if ((short)local_e0._8_2_ < 0) {
              uVar8 = local_d6._2_4_;
            }
            iVar20 = UnicodeString::indexOf
                               ((UnicodeString *)local_e0,L";%",0,2,uVar23,uVar8 - uVar23);
            uVar24 = uVar24 + 1;
            lVar26 = lVar26 + 0x40;
            this = local_a0;
            uVar23 = uVar7;
          } while (iVar20 != -1);
        }
        uVar25 = uVar24 & 0xffffffff;
        if (-1 < (short)local_e0._8_2_) {
          local_d6._2_4_ = (int)(short)local_e0._8_2_ >> 5;
        }
        pUVar12 = (UnicodeString *)local_e0;
        UnicodeString::setTo
                  (this->ruleSetDescriptions + uVar25,pUVar12,uVar7,local_d6._2_4_ - uVar7);
        pNVar15 = (NFRuleSet *)UMemory::operator_new((UMemory *)0xa8,(size_t)pUVar12);
        if (pNVar15 != (NFRuleSet *)0x0) {
          NFRuleSet::NFRuleSet(pNVar15,this,this->ruleSetDescriptions,(int32_t)uVar24,in_R8);
        }
        this->fRuleSets[uVar25] = pNVar15;
        UVar19 = U_MEMORY_ALLOCATION_ERROR;
        if (this->fRuleSets[uVar25] != (NFRuleSet *)0x0) {
          initDefaultRuleSet(this);
          if (0 < this->numRuleSets) {
            lVar26 = 0;
            lVar18 = 0;
            do {
              NFRuleSet::parseRules
                        (this->fRuleSets[lVar18],
                         (UnicodeString *)
                         ((long)&(this->ruleSetDescriptions->super_Replaceable).super_UObject.
                                 _vptr_UObject + lVar26),in_R8);
              lVar18 = lVar18 + 1;
              lVar26 = lVar26 + 0x40;
            } while (lVar18 < this->numRuleSets);
          }
          if (local_88 != (LocalizationInfo *)0x0) {
            for (uVar7 = 0; iVar20 = (*local_88->_vptr_LocalizationInfo[3])(local_88),
                (int)uVar7 < iVar20; uVar7 = uVar7 + 1) {
              iVar20 = (*local_88->_vptr_LocalizationInfo[4])(local_88,(ulong)uVar7);
              local_98.p_ = (char16_t *)CONCAT44(extraout_var,iVar20);
              UnicodeString::UnicodeString(&local_70,'\x01',&local_98,-1);
              local_80 = local_98.p_;
              pNVar15 = findRuleSet(this,&local_70,in_R8);
              if (pNVar15 == (NFRuleSet *)0x0) {
                UnicodeString::~UnicodeString(&local_70);
                break;
              }
              if (uVar7 == 0) {
                this->defaultRuleSet = pNVar15;
              }
              UnicodeString::~UnicodeString(&local_70);
            }
          }
          UnicodeString::operator=(&this->originalDescription,local_90);
          goto LAB_0021cbc6;
        }
      }
    }
    else {
      if (uVar7 != 0) {
        uVar8 = (int)(short)local_e0._8_2_ >> 5;
        uVar23 = uVar8;
        if ((short)local_e0._8_2_ < 0) {
          uVar23 = local_d6._2_4_;
        }
        if (uVar7 - 1 < uVar23) {
          pcVar17 = (char16_t *)local_d6._14_8_;
          if (((int)(short)local_e0._8_2_ & 2U) != 0) {
            pcVar17 = local_d6;
          }
          if (pcVar17[(int)(uVar7 - 1)] == L';') {
            if (-1 < (int)uVar7) goto LAB_0021c5e9;
            uVar8 = 0;
            goto LAB_0021c5fc;
          }
        }
        goto LAB_0021c79d;
      }
      uVar8 = (int)(short)local_e0._8_2_ >> 5;
LAB_0021c5e9:
      uVar23 = uVar8;
      if ((short)local_e0._8_2_ < 0) {
        uVar23 = local_d6._2_4_;
      }
      uVar8 = uVar7;
      if ((int)uVar23 < (int)uVar7) {
        uVar8 = uVar23;
      }
LAB_0021c5fc:
      pUVar21 = L";%";
      iVar9 = UnicodeString::indexOf((UnicodeString *)local_e0,L";%",0,2,uVar8,uVar23 - uVar8);
      if (iVar9 == -1) {
        uVar23 = local_d6._2_4_;
        if (-1 < (short)local_e0._8_2_) {
          uVar23 = (int)(short)local_e0._8_2_ >> 5;
        }
        iVar9 = uVar23 - 1;
      }
      iVar10 = u_strlen_63(L"%%lenient-parse:");
      lVar26 = (long)(int)(iVar10 + uVar7);
      do {
        uVar23 = local_d6._2_4_;
        if (-1 < (short)local_e0._8_2_) {
          uVar23 = (int)(short)local_e0._8_2_ >> 5;
        }
        uVar8 = 0xffff;
        if ((uint)lVar26 < uVar23) {
          pcVar17 = local_d6;
          if (((int)(short)local_e0._8_2_ & 2U) == 0) {
            pcVar17 = (char16_t *)local_d6._14_8_;
          }
          uVar8 = (uint)(ushort)pcVar17[lVar26];
        }
        UVar6 = PatternProps::isWhiteSpace(uVar8);
        lVar26 = lVar26 + 1;
      } while (UVar6 != '\0');
      pUVar12 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)pUVar21);
      if (pUVar12 != (UnicodeString *)0x0) {
        (pUVar12->super_Replaceable).super_UObject._vptr_UObject =
             (_func_int **)&PTR__UnicodeString_003e5ab8;
        (pUVar12->fUnion).fStackFields.fLengthAndFlags = 2;
        this->lenientParseRules = pUVar12;
        UnicodeString::unBogus(pUVar12);
        sVar2 = (pUVar12->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar10 = (pUVar12->fUnion).fFields.fLength;
        }
        else {
          iVar10 = (int)sVar2 >> 5;
        }
        UnicodeString::doReplace
                  (pUVar12,0,iVar10,(UnicodeString *)local_e0,(int)lVar26 + -1,
                   (iVar9 - (int)lVar26) + 1);
        iVar20 = (iVar9 - uVar7) + 1;
        if (((int)uVar7 < 1) && (iVar20 == 0x7fffffff)) {
          uVar16 = local_e0._8_2_ & 0x1e;
          uVar5 = local_e0._8_2_ & 1;
          local_e0._8_2_ = 2;
          if (uVar5 == 0) {
            local_e0._8_2_ = uVar16;
          }
        }
        else {
          UnicodeString::doReplace((UnicodeString *)local_e0,uVar7,iVar20,(UChar *)0x0,0,0);
        }
        goto LAB_0021c79d;
      }
      lVar26 = 0x290;
LAB_0021ca6b:
      UVar19 = U_MEMORY_ALLOCATION_ERROR;
      pcVar1 = (this->super_NumberFormat).super_Format.actualLocale + lVar26 + -8;
      pcVar1[0] = '\0';
      pcVar1[1] = '\0';
      pcVar1[2] = '\0';
      pcVar1[3] = '\0';
      pcVar1[4] = '\0';
      pcVar1[5] = '\0';
      pcVar1[6] = '\0';
      pcVar1[7] = '\0';
    }
  }
LAB_0021cbc2:
  *in_R8 = UVar19;
LAB_0021cbc6:
  UnicodeString::~UnicodeString((UnicodeString *)local_e0);
  return extraout_EAX;
}

Assistant:

void
RuleBasedNumberFormat::init(const UnicodeString& rules, LocalizationInfo* localizationInfos,
                            UParseError& pErr, UErrorCode& status)
{
    // TODO: implement UParseError
    uprv_memset(&pErr, 0, sizeof(UParseError));
    // Note: this can leave ruleSets == NULL, so remaining code should check
    if (U_FAILURE(status)) {
        return;
    }

    initializeDecimalFormatSymbols(status);
    initializeDefaultInfinityRule(status);
    initializeDefaultNaNRule(status);
    if (U_FAILURE(status)) {
        return;
    }

    this->localizations = localizationInfos == NULL ? NULL : localizationInfos->ref();

    UnicodeString description(rules);
    if (!description.length()) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    // start by stripping the trailing whitespace from all the rules
    // (this is all the whitespace follwing each semicolon in the
    // description).  This allows us to look for rule-set boundaries
    // by searching for ";%" without having to worry about whitespace
    // between the ; and the %
    stripWhitespace(description);

    // check to see if there's a set of lenient-parse rules.  If there
    // is, pull them out into our temporary holding place for them,
    // and delete them from the description before the real desciption-
    // parsing code sees them
    int32_t lp = description.indexOf(gLenientParse, -1, 0);
    if (lp != -1) {
        // we've got to make sure we're not in the middle of a rule
        // (where "%%lenient-parse" would actually get treated as
        // rule text)
        if (lp == 0 || description.charAt(lp - 1) == gSemiColon) {
            // locate the beginning and end of the actual collation
            // rules (there may be whitespace between the name and
            // the first token in the description)
            int lpEnd = description.indexOf(gSemiPercent, 2, lp);

            if (lpEnd == -1) {
                lpEnd = description.length() - 1;
            }
            int lpStart = lp + u_strlen(gLenientParse);
            while (PatternProps::isWhiteSpace(description.charAt(lpStart))) {
                ++lpStart;
            }

            // copy out the lenient-parse rules and delete them
            // from the description
            lenientParseRules = new UnicodeString();
            /* test for NULL */
            if (lenientParseRules == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            lenientParseRules->setTo(description, lpStart, lpEnd - lpStart);

            description.remove(lp, lpEnd + 1 - lp);
        }
    }

    // pre-flight parsing the description and count the number of
    // rule sets (";%" marks the end of one rule set and the beginning
    // of the next)
    numRuleSets = 0;
    for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, p)) {
        ++numRuleSets;
        ++p;
    }
    ++numRuleSets;

    // our rule list is an array of the appropriate size
    fRuleSets = (NFRuleSet **)uprv_malloc((numRuleSets + 1) * sizeof(NFRuleSet *));
    /* test for NULL */
    if (fRuleSets == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    for (int i = 0; i <= numRuleSets; ++i) {
        fRuleSets[i] = NULL;
    }

    // divide up the descriptions into individual rule-set descriptions
    // and store them in a temporary array.  At each step, we also
    // new up a rule set, but all this does is initialize its name
    // and remove it from its description.  We can't actually parse
    // the rest of the descriptions and finish initializing everything
    // because we have to know the names and locations of all the rule
    // sets before we can actually set everything up
    if(!numRuleSets) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    ruleSetDescriptions = new UnicodeString[numRuleSets];
    if (ruleSetDescriptions == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }

    {
        int curRuleSet = 0;
        int32_t start = 0;
        for (int32_t p = description.indexOf(gSemiPercent, 2, 0); p != -1; p = description.indexOf(gSemiPercent, 2, start)) {
            ruleSetDescriptions[curRuleSet].setTo(description, start, p + 1 - start);
            fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
            if (fRuleSets[curRuleSet] == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return;
            }
            ++curRuleSet;
            start = p + 1;
        }
        ruleSetDescriptions[curRuleSet].setTo(description, start, description.length() - start);
        fRuleSets[curRuleSet] = new NFRuleSet(this, ruleSetDescriptions, curRuleSet, status);
        if (fRuleSets[curRuleSet] == nullptr) {
            status = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }

    // now we can take note of the formatter's default rule set, which
    // is the last public rule set in the description (it's the last
    // rather than the first so that a user can create a new formatter
    // from an existing formatter and change its default behavior just
    // by appending more rule sets to the end)

    // {dlf} Initialization of a fraction rule set requires the default rule
    // set to be known.  For purposes of initialization, this is always the 
    // last public rule set, no matter what the localization data says.
    initDefaultRuleSet();

    // finally, we can go back through the temporary descriptions
    // list and finish setting up the substructure (and we throw
    // away the temporary descriptions as we go)
    {
        for (int i = 0; i < numRuleSets; i++) {
            fRuleSets[i]->parseRules(ruleSetDescriptions[i], status);
        }
    }

    // Now that the rules are initialized, the 'real' default rule
    // set can be adjusted by the localization data.

    // The C code keeps the localization array as is, rather than building
    // a separate array of the public rule set names, so we have less work
    // to do here-- but we still need to check the names.
    
    if (localizationInfos) {
        // confirm the names, if any aren't in the rules, that's an error
        // it is ok if the rules contain public rule sets that are not in this list
        for (int32_t i = 0; i < localizationInfos->getNumberOfRuleSets(); ++i) {
            UnicodeString name(TRUE, localizationInfos->getRuleSetName(i), -1);
            NFRuleSet* rs = findRuleSet(name, status);
            if (rs == NULL) {
                break; // error
            }
            if (i == 0) {
                defaultRuleSet = rs;
            }
        }
    } else {
        defaultRuleSet = getDefaultRuleSet();
    }
    originalDescription = rules;
}